

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.h
# Opt level: O0

void __thiscall flatbuffers::CodeGenerator::~CodeGenerator(CodeGenerator *this)

{
  code *pcVar1;
  CodeGenerator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~CodeGenerator() = default;